

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader.cc
# Opt level: O2

Result __thiscall
wabt::anon_unknown_26::BinaryReader::ReadTagType(BinaryReader *this,Index *out_sig_index)

{
  Result RVar1;
  Enum EVar2;
  uint8_t attribute;
  
  RVar1 = ReadU8(this,&attribute,"tag attribute");
  EVar2 = Error;
  if (RVar1.enum_ != Error) {
    if (attribute == '\0') {
      RVar1 = ReadIndex(this,out_sig_index,"tag signature index");
      EVar2 = (Enum)(RVar1.enum_ == Error);
    }
    else {
      PrintError(this,"tag attribute must be 0");
    }
  }
  return (Result)EVar2;
}

Assistant:

Result BinaryReader::ReadTagType(Index* out_sig_index) {
  uint8_t attribute;
  CHECK_RESULT(ReadU8(&attribute, "tag attribute"));
  ERROR_UNLESS(attribute == 0, "tag attribute must be 0");
  CHECK_RESULT(ReadIndex(out_sig_index, "tag signature index"));
  return Result::Ok;
}